

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Armijo.cpp
# Opt level: O0

RealType __thiscall
QuantLib::ArmijoLineSearch::operator()
          (ArmijoLineSearch *this,Problem *P,Type *ecType,EndCriteria *endCriteria,RealType t_ini)

{
  bool bVar1;
  Problem *this_00;
  EndCriteria *in_RCX;
  Type *in_RDX;
  Problem *in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  RealType RVar2;
  Constraint *in_stack_00000020;
  RealType in_stack_00000028;
  DynamicVector<double,_std::allocator<double>_> *in_stack_00000030;
  DynamicVector<double,_std::allocator<double>_> *in_stack_00000038;
  LineSearch *in_stack_00000040;
  RealType qp0;
  RealType q0;
  size_t loopNumber;
  RealType t;
  RealType qtold;
  bool maxIter;
  Constraint *constraint;
  undefined7 in_stack_ffffffffffffff48;
  byte in_stack_ffffffffffffff4f;
  DynamicVector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  DynamicVector<double,_std::allocator<double>_> *in_stack_ffffffffffffff58;
  DynamicVector<double,_std::allocator<double>_> *v1;
  Problem *in_stack_ffffffffffffff60;
  Problem *this_01;
  DynamicVector<double,_std::allocator<double>_> local_79;
  Problem *local_60;
  RealType local_58;
  size_t local_50;
  double local_48;
  double local_40;
  byte local_31;
  Constraint *local_30;
  undefined8 local_28;
  EndCriteria *local_20;
  Type *local_18;
  Problem *local_10;
  
  local_28 = in_XMM0_Qa;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30 = Problem::constraint(in_RSI);
  *(undefined1 *)(in_RDI + 0x60) = 1;
  local_31 = 0;
  local_48 = (double)local_28;
  local_50 = 0;
  local_58 = Problem::functionValue(local_10);
  local_60 = (Problem *)Problem::gradientNormValue(local_10);
  *(RealType *)(in_RDI + 0x50) = local_58;
  bVar1 = OpenMD::DynamicVector<double,_std::allocator<double>_>::empty
                    ((DynamicVector<double,_std::allocator<double>_> *)0x39cd0d);
  this_01 = local_60;
  if (!bVar1) {
    RVar2 = Problem::DotProduct(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                in_stack_ffffffffffffff50);
    this_01 = (Problem *)((ulong)RVar2 ^ 0x8000000000000000);
  }
  *(Problem **)(in_RDI + 0x58) = this_01;
  Problem::currentValue(local_10);
  this_00 = (Problem *)
            OpenMD::DynamicVector<double,_std::allocator<double>_>::size
                      ((DynamicVector<double,_std::allocator<double>_> *)0x39cd80);
  v1 = &local_79;
  std::allocator<double>::allocator((allocator<double> *)0x39cd94);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)this_00,
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
             (allocator_type *)0x39cda8);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::operator=
            ((DynamicVector<double,_std::allocator<double>_> *)this_00,
             (DynamicVector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x39cdc7);
  std::allocator<double>::~allocator((allocator<double> *)0x39cdd1);
  Problem::currentValue(local_10);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::operator=
            ((DynamicVector<double,_std::allocator<double>_> *)this_00,
             (DynamicVector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  local_48 = LineSearch::update(in_stack_00000040,in_stack_00000038,in_stack_00000030,
                                in_stack_00000028,in_stack_00000020);
  RVar2 = Problem::value(this_00,(DynamicVector<double,_std::allocator<double>_> *)
                                 CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  *(RealType *)(in_RDI + 0x50) = RVar2;
  if (-*(double *)(in_RDI + 0x68) * local_48 * *(double *)(in_RDI + 0x58) <
      *(double *)(in_RDI + 0x50) - local_58) {
    do {
      local_50 = local_50 + 1;
      local_48 = *(double *)(in_RDI + 0x70) * local_48;
      local_40 = *(double *)(in_RDI + 0x50);
      Problem::currentValue(local_10);
      OpenMD::DynamicVector<double,_std::allocator<double>_>::operator=
                ((DynamicVector<double,_std::allocator<double>_> *)this_00,
                 (DynamicVector<double,_std::allocator<double>_> *)
                 CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      local_48 = LineSearch::update(in_stack_00000040,in_stack_00000038,in_stack_00000030,
                                    in_stack_00000028,in_stack_00000020);
      RVar2 = Problem::value(this_00,(DynamicVector<double,_std::allocator<double>_> *)
                                     CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      *(RealType *)(in_RDI + 0x50) = RVar2;
      Problem::gradient(this_00,(DynamicVector<double,_std::allocator<double>_> *)
                                CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                        (DynamicVector<double,_std::allocator<double>_> *)0x39cf2a);
      local_31 = EndCriteria::checkMaxIterations(local_20,local_50,local_18);
      if ((-*(double *)(in_RDI + 0x68) * local_48 * *(double *)(in_RDI + 0x58) <
           *(double *)(in_RDI + 0x50) - local_58) ||
         (in_stack_ffffffffffffff4f = 0,
         local_40 - local_58 <=
         (-*(double *)(in_RDI + 0x68) * local_48 * *(double *)(in_RDI + 0x58)) /
         *(double *)(in_RDI + 0x70))) {
        in_stack_ffffffffffffff4f = local_31 ^ 0xff;
      }
    } while ((in_stack_ffffffffffffff4f & 1) != 0);
  }
  if ((local_31 & 1) != 0) {
    *(undefined1 *)(in_RDI + 0x60) = 0;
  }
  Problem::gradient(this_00,(DynamicVector<double,_std::allocator<double>_> *)
                            CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                    (DynamicVector<double,_std::allocator<double>_> *)0x39d038);
  RVar2 = Problem::DotProduct(this_01,v1,(DynamicVector<double,_std::allocator<double>_> *)this_00);
  *(RealType *)(in_RDI + 0x58) = RVar2;
  return local_48;
}

Assistant:

RealType ArmijoLineSearch::operator()(Problem& P, EndCriteria::Type& ecType,
                                        const EndCriteria& endCriteria,
                                        const RealType t_ini) {
    // OptimizationMethod& method = P.method();
    Constraint& constraint = P.constraint();
    succeed_               = true;
    bool maxIter           = false;
    RealType qtold, t = t_ini;
    size_t loopNumber = 0;

    RealType q0  = P.functionValue();
    RealType qp0 = P.gradientNormValue();

    qt_ = q0;
    qpt_ =
        (gradient_.empty()) ? qp0 : -P.DotProduct(gradient_, searchDirection_);

    // Initialize gradient
    gradient_ = DynamicVector<RealType>(P.currentValue().size());
    // Compute new point
    xtd_ = P.currentValue();
    t    = update(xtd_, searchDirection_, t, constraint);
    // Compute function value at the new point
    qt_ = P.value(xtd_);

    // Enter in the loop if the criterion is not satisfied
    if ((qt_ - q0) > -alpha_ * t * qpt_) {
      do {
        loopNumber++;
        // Decrease step
        t *= beta_;
        // Store old value of the function
        qtold = qt_;
        // New point value
        xtd_ = P.currentValue();
        t    = update(xtd_, searchDirection_, t, constraint);

        // Compute function value at the new point
        qt_ = P.value(xtd_);
        P.gradient(gradient_, xtd_);
        // and it squared norm
        maxIter = endCriteria.checkMaxIterations(loopNumber, ecType);
      } while ((((qt_ - q0) > (-alpha_ * t * qpt_)) ||
                ((qtold - q0) <= (-alpha_ * t * qpt_ / beta_))) &&
               (!maxIter));
    }

    if (maxIter) succeed_ = false;

    // Compute new gradient
    P.gradient(gradient_, xtd_);
    // and it squared norm
    // qpt_ = P.computeGradientNormValue(gradient_);
    qpt_ = P.DotProduct(gradient_, gradient_);

    // Return new step value
    return t;
  }